

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::finishSendingError(Connection *this,Promise<void> *promise)

{
  bool bVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar2;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Promise<void> *pPVar3;
  Promise<void> *this_01;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  HttpOutputStream *this_02;
  Promise<void> *in_RDX;
  void *pvVar4;
  void *in_stack_fffffffffffff8f0;
  Promise<void> *promise_local;
  Connection *this_local;
  
  puVar2 = (undefined8 *)operator_new(0x5e8);
  *puVar2 = finishSendingError;
  puVar2[1] = finishSendingError;
  this_01 = (Promise<void> *)(puVar2 + 0xb8);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar2 + 0x47);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar2 + 0x7e);
  this_02 = (HttpOutputStream *)(puVar2 + 0xba);
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(puVar2 + 2);
  puVar2[0xbb] = promise;
  Promise<void>::Promise(this_01,in_RDX);
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0xb5),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"finishSendingError",0x1f6e,0x1b);
  pvVar4 = (void *)puVar2[0xb7];
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine
            (this_00,*(SourceLocation *)(puVar2 + 0xb5));
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x5e5));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x5e5));
    pPVar3 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
             await_transform<kj::Promise<void>&>(this_00,this_01);
    co_await<void>(__return_storage_ptr__,pPVar3);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x5e4) = 1;
      finishSendingError(in_stack_fffffffffffff8f0,pvVar4);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    bVar1 = anon_unknown_36::HttpOutputStream::isBroken((HttpOutputStream *)(puVar2[0xbb] + 0x128));
    if (!bVar1) {
      anon_unknown_36::HttpOutputStream::flush(this_02);
      pPVar3 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
               await_transform<kj::Promise<void>>(this_00,(Promise<void> *)this_02);
      co_await<void>(__return_storage_ptr___00,pPVar3);
      bVar1 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar1) {
        *(undefined1 *)((long)puVar2 + 0x5e4) = 2;
        finishSendingError(in_stack_fffffffffffff8f0,pvVar4);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<void>::~Promise((Promise<void> *)this_02);
    }
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,BREAK_LOOP_CONN_ERR);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x5e6));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x5e6));
      kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_00);
      Promise<void>::~Promise(this_01);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x5e8);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x5e4) = 3;
      finishSendingError(in_stack_fffffffffffff8f0,pvVar4);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x5e4) = 0;
    finishSendingError(in_stack_fffffffffffff8f0,pvVar4);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> finishSendingError(kj::Promise<void> promise) {
    co_await promise;
    if (!httpOutput.isBroken()) {
      // Skip flush for broken streams, since it will throw an exception that may be worse than
      // the one we just handled.
      co_await httpOutput.flush();
    }
    co_return BREAK_LOOP_CONN_ERR;
  }